

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DebugLogV(char *fmt,__va_list_tag *args)

{
  ImGuiTextBuffer *this;
  int iVar1;
  ImGuiContext *pIVar2;
  int new_size;
  int old_size;
  char *pcVar3;
  char *pcVar4;
  
  pIVar2 = GImGui;
  iVar1 = (GImGui->DebugLogBuf).Buf.Size;
  old_size = iVar1 + -1;
  if (iVar1 == 0) {
    old_size = 0;
  }
  this = &GImGui->DebugLogBuf;
  if (GImGui->ContextName[0] == '\0') {
    ImGuiTextBuffer::appendf(this,"[%05d] ",(ulong)(uint)GImGui->FrameCount);
  }
  else {
    ImGuiTextBuffer::appendf(this,"[%s] [%05d] ",GImGui->ContextName);
  }
  ImGuiTextBuffer::appendfv(this,fmt,args);
  pcVar3 = (pIVar2->DebugLogBuf).Buf.Data;
  if (pcVar3 == (char *)0x0) {
    pcVar3 = ImGuiTextBuffer::EmptyString;
  }
  iVar1 = (pIVar2->DebugLogBuf).Buf.Size;
  new_size = iVar1 + -1;
  if (iVar1 == 0) {
    new_size = 0;
  }
  ImGuiTextIndex::append(&pIVar2->DebugLogIndex,pcVar3,old_size,new_size);
  if ((pIVar2->DebugLogFlags & 0x100000) == 0) {
    return;
  }
  pcVar3 = (pIVar2->DebugLogBuf).Buf.Data;
  pcVar4 = ImGuiTextBuffer::EmptyString;
  if (pcVar3 != (char *)0x0) {
    pcVar4 = pcVar3;
  }
  printf("%s",pcVar4 + old_size);
  return;
}

Assistant:

void ImGui::DebugLogV(const char* fmt, va_list args)
{
    ImGuiContext& g = *GImGui;
    const int old_size = g.DebugLogBuf.size();
    if (g.ContextName[0] != 0)
        g.DebugLogBuf.appendf("[%s] [%05d] ", g.ContextName, g.FrameCount);
    else
        g.DebugLogBuf.appendf("[%05d] ", g.FrameCount);
    g.DebugLogBuf.appendfv(fmt, args);
    g.DebugLogIndex.append(g.DebugLogBuf.c_str(), old_size, g.DebugLogBuf.size());
    if (g.DebugLogFlags & ImGuiDebugLogFlags_OutputToTTY)
        IMGUI_DEBUG_PRINTF("%s", g.DebugLogBuf.begin() + old_size);
#ifdef IMGUI_ENABLE_TEST_ENGINE
    // IMGUI_TEST_ENGINE_LOG() adds a trailing \n automatically
    const int new_size = g.DebugLogBuf.size();
    const bool trailing_carriage_return = (g.DebugLogBuf[new_size - 1] == '\n');
    if (g.DebugLogFlags & ImGuiDebugLogFlags_OutputToTestEngine)
        IMGUI_TEST_ENGINE_LOG("%.*s", new_size - old_size - (trailing_carriage_return ? 1 : 0), g.DebugLogBuf.begin() + old_size);
#endif
}